

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O2

void * helper_lookup_tb_ptr_riscv32(CPUArchState_conflict25 *env)

{
  uint pc;
  long lVar1;
  CPURISCVState_conflict *env_00;
  _Bool _Var2;
  uint flags;
  TranslationBlock_conflict *pTVar3;
  tb_tc *ptVar4;
  uint32_t cf_mask;
  uint uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)(env[-3].gpr + 4);
  env_00 = *(CPURISCVState_conflict **)(env[-0x25].gpr + 8);
  pc = env_00->pc;
  flags = riscv_cpu_mmu_index_riscv32(env_00,false);
  _Var2 = riscv_cpu_fp_enabled_riscv32(env_00);
  if (_Var2) {
    flags = flags | env_00->mstatus & 0x6000;
  }
  uVar5 = pc >> 6 ^ pc;
  uVar6 = (ulong)(uVar5 & 0x3f | uVar5 >> 6 & 0xfc0);
  pTVar3 = *(TranslationBlock_conflict **)((long)env + uVar6 * 8 + -0x8bb8);
  cf_mask = *(int *)((long)&env[-4].uc + 4) << 0x18;
  if ((((pTVar3 == (TranslationBlock_conflict *)0x0) || (pTVar3->pc != pc)) ||
      (pTVar3->cs_base != 0)) ||
     (((pTVar3->flags != flags || (env[-4].timer != (QEMUTimer *)(ulong)pTVar3->trace_vcpu_dstate))
      || ((pTVar3->cflags & 0xff0effff) != cf_mask)))) {
    pTVar3 = tb_htable_lookup_riscv32
                       ((CPUState_conflict *)(env[-0x26].pmp_state.pmp + 5),pc,0,flags,cf_mask);
    if (pTVar3 == (TranslationBlock_conflict *)0x0) {
      ptVar4 = (tb_tc *)(*(long *)(lVar1 + 0x2e8) + 0x98);
      goto LAB_00a61654;
    }
    *(TranslationBlock_conflict **)((long)env + uVar6 * 8 + -0x8bb8) = pTVar3;
  }
  ptVar4 = &pTVar3->tc;
LAB_00a61654:
  return ptVar4->ptr;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}